

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_creation.cpp
# Opt level: O0

Ref<embree::SceneGraph::Node>
embree::SceneGraph::createPointSphere
          (Vec3fa *center,float radius,float pointRadius,size_t N,PointSubtype subtype,
          Ref<embree::SceneGraph::MaterialNode> *material)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  undefined8 uVar7;
  ulong uVar8;
  _func_int **pp_Var9;
  reference pvVar10;
  Vec3fx *pVVar11;
  reference pvVar12;
  unsigned_long *puVar13;
  Vec3fa *pVVar14;
  int in_ECX;
  uint in_EDX;
  float *in_RSI;
  Node *in_RDI;
  long *in_R8;
  float in_XMM0_Da;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float in_XMM1_Da;
  float thetaf;
  float phif;
  uint theta;
  uint phi;
  float rcpNumPhi;
  float rcpNumTheta;
  Ref<embree::SceneGraph::PointSetNode> mesh;
  RTCGeometryType type;
  uint numVertices;
  uint numTheta;
  uint numPhi;
  __m128 r_1;
  __m128 a_1;
  __m128 r;
  __m128 a;
  __m128 c_1;
  __m128 r_2;
  __m128 a_3;
  vfloat4 c;
  vfloat4 b;
  vfloat4 a_2;
  size_t i_9;
  size_t i_4;
  size_t i_8;
  size_t i_7;
  Vec3fa *old_items_1;
  size_t i_6;
  size_t i_5;
  size_t new_size_alloced_1;
  size_t i_3;
  size_t i_2;
  Vec3fx *old_items;
  size_t i_1;
  size_t i;
  size_t new_size_alloced;
  value_type *in_stack_fffffffffffff2a8;
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  *in_stack_fffffffffffff2b0;
  size_t in_stack_fffffffffffff2b8;
  undefined4 in_stack_fffffffffffff330;
  undefined4 in_stack_fffffffffffff334;
  undefined4 in_stack_fffffffffffff338;
  float fVar19;
  undefined4 in_stack_fffffffffffff33c;
  undefined8 in_stack_fffffffffffff340;
  RTCGeometryType type_00;
  undefined4 in_stack_fffffffffffff348;
  undefined4 in_stack_fffffffffffff34c;
  BBox1f in_stack_fffffffffffff350;
  undefined8 local_b88;
  undefined8 uStack_b80;
  undefined8 local_b78;
  undefined8 uStack_b70;
  undefined8 local_b68;
  undefined8 uStack_b60;
  float local_b58;
  float local_b54;
  uint local_b50;
  uint local_b4c;
  float local_b48;
  float local_b44;
  undefined1 local_b40 [8];
  ulong local_b38;
  undefined8 local_b30;
  undefined8 local_b28;
  undefined1 local_b1d;
  undefined4 local_b1c;
  undefined4 local_b18;
  undefined4 local_b14;
  undefined4 uStack_b10;
  long *local_b00;
  _func_int **local_af8;
  undefined4 local_af0;
  uint local_aec;
  uint local_ae8;
  uint local_ae4;
  int local_ad4;
  float local_ac8;
  float local_ac4;
  float *local_ac0;
  long **local_aa8;
  undefined4 *local_aa0;
  undefined4 *local_a98;
  undefined4 *local_a90;
  long **local_a88;
  ulong local_a78;
  reference local_a70;
  ulong local_a68;
  reference local_a60;
  undefined1 local_a58 [16];
  ulong local_a48;
  undefined8 uStack_a40;
  float local_a2c;
  undefined1 local_a28 [16];
  ulong local_a18;
  undefined8 uStack_a10;
  float local_9fc;
  undefined1 *local_9f8;
  undefined1 *local_9f0;
  float local_9e4;
  float local_9e0;
  float local_9dc;
  float local_9d8;
  float local_9d4;
  undefined8 *local_9d0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_9c8;
  undefined8 *local_9c0;
  undefined8 *local_9b8;
  _func_int **local_9b0;
  _func_int ***local_9a8;
  _func_int ***local_9a0;
  _func_int ***local_998;
  _func_int ***local_990;
  _func_int ***local_988;
  _func_int ***local_980;
  _func_int ***local_978;
  _func_int ***local_970;
  _func_int ***local_968;
  _func_int ***local_960;
  ulong local_958;
  reference local_950;
  ulong local_948;
  reference local_940;
  ulong local_938;
  reference local_930;
  ulong local_928;
  reference local_920;
  ulong local_918;
  reference local_910;
  ulong local_908;
  reference local_900;
  _func_int ***local_8f8;
  _func_int ***local_8e8;
  undefined1 *local_8d8;
  undefined1 *local_8d0;
  float *local_8c0;
  undefined8 *local_8b8;
  undefined8 *local_8b0;
  Vec3fx *local_8a8;
  undefined8 *local_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined8 *local_880;
  float local_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  undefined8 *local_860;
  undefined1 local_858 [16];
  undefined4 local_83c;
  undefined1 local_838 [16];
  float local_81c;
  undefined1 local_818 [16];
  undefined4 local_7fc;
  undefined1 local_7f8 [16];
  float local_7dc;
  ulong local_7d8;
  undefined8 uStack_7d0;
  ulong local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  ulong local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  ulong local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  undefined8 uStack_760;
  ulong local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  ulong local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  ulong local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  ulong local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  float local_6c4;
  undefined8 *local_6c0;
  undefined8 *local_6b8;
  undefined8 *local_6b0;
  undefined8 *local_6a8;
  undefined8 *local_6a0;
  float local_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  undefined8 *local_680;
  float local_674;
  undefined8 *local_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  float local_648;
  float fStack_644;
  float fStack_640;
  float fStack_63c;
  float local_638;
  ulong local_628;
  undefined8 uStack_620;
  undefined1 local_618 [16];
  ulong local_608;
  undefined8 uStack_600;
  float local_5ec;
  undefined1 local_5e8 [16];
  undefined4 local_5cc;
  undefined1 local_5c8 [16];
  undefined4 local_5ac;
  undefined1 local_5a8 [16];
  float local_58c;
  ulong local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  ulong local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  ulong local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  ulong local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  ulong local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 *local_4c0;
  undefined8 *local_4b8;
  undefined8 *local_4b0;
  undefined8 *local_4a8;
  undefined8 *local_4a0;
  float local_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  undefined8 *local_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  ulong local_458;
  undefined8 uStack_450;
  ulong local_448;
  undefined8 uStack_440;
  ulong local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 *local_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 *local_3a8;
  undefined8 *local_3a0;
  undefined8 *local_398;
  undefined8 *local_390;
  undefined8 *local_388;
  undefined8 *local_380;
  undefined8 *local_378;
  undefined8 *local_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  undefined8 *local_338;
  undefined8 *local_330;
  undefined8 *local_328;
  undefined8 *local_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  undefined8 *local_2e8;
  undefined8 *local_2e0;
  undefined8 *local_2d8;
  undefined8 *local_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 *local_2b0;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 *local_280;
  undefined8 *local_278;
  undefined8 *local_270;
  undefined8 *local_268;
  undefined8 *local_260;
  undefined8 *local_258;
  undefined8 *local_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 *local_230;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 *local_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  ulong local_1c0;
  undefined1 *local_1b8;
  undefined8 local_1b0;
  undefined8 local_1a8;
  undefined1 *local_1a0;
  ulong local_180;
  ulong local_178;
  Vec3fa *local_170;
  ulong local_168;
  ulong local_160;
  size_t local_158;
  ulong local_150;
  reference local_148;
  Vec3fa *local_140;
  Vec3fa *local_138;
  Vec3fa *local_130;
  Vec3fa *local_128;
  size_t local_120;
  Vec3fa *local_118;
  reference local_110;
  size_t local_108;
  reference local_100;
  unsigned_long local_f8 [2];
  ulong local_e8;
  ulong local_e0;
  reference local_d8;
  size_t local_d0;
  _func_int **local_c8;
  ulong local_b8;
  ulong local_b0;
  Vec3fx *local_a8;
  ulong local_a0;
  ulong local_98;
  size_t local_90;
  ulong local_88;
  reference local_80;
  size_t local_78;
  reference local_70;
  Vec3fx *local_68;
  Vec3fx *local_60;
  size_t local_58;
  Vec3fx *local_50;
  reference local_48;
  unsigned_long local_40 [2];
  ulong local_30;
  ulong local_28;
  reference local_20;
  size_t local_18;
  Vec3fx *local_10;
  Vec3fx *local_8;
  
  type_00 = (RTCGeometryType)((ulong)in_stack_fffffffffffff340 >> 0x20);
  local_ae8 = in_EDX * 2;
  local_aec = local_ae8 * (in_EDX + 1);
  if (in_ECX == 0) {
    local_af0 = 0x32;
  }
  else if (in_ECX == 1) {
    local_af0 = 0x33;
  }
  else if (in_ECX == 2) {
    local_af0 = 0x34;
  }
  local_ae4 = in_EDX;
  local_ad4 = in_ECX;
  local_ac8 = in_XMM1_Da;
  local_ac4 = in_XMM0_Da;
  local_ac0 = in_RSI;
  pp_Var9 = (_func_int **)::operator_new(0xb0);
  local_b1d = 1;
  local_aa8 = &local_b00;
  local_b00 = (long *)*in_R8;
  if (local_b00 != (long *)0x0) {
    (**(code **)(*local_b00 + 0x10))();
  }
  local_b18 = 0;
  local_b1c = 0x3f800000;
  local_a90 = &local_b14;
  local_a98 = &local_b18;
  local_aa0 = &local_b1c;
  local_b14 = 0;
  uStack_b10 = 0x3f800000;
  PointSetNode::PointSetNode
            ((PointSetNode *)CONCAT44(in_stack_fffffffffffff34c,in_stack_fffffffffffff348),type_00,
             (Ref<embree::SceneGraph::MaterialNode> *)
             CONCAT44(in_stack_fffffffffffff33c,in_stack_fffffffffffff338),in_stack_fffffffffffff350
             ,CONCAT44(in_stack_fffffffffffff334,in_stack_fffffffffffff330));
  local_b1d = 0;
  local_9a8 = &local_af8;
  local_9b0 = pp_Var9;
  local_af8 = pp_Var9;
  if (pp_Var9 != (_func_int **)0x0) {
    (**(code **)(*pp_Var9 + 0x10))();
  }
  local_a88 = &local_b00;
  if (local_b00 != (long *)0x0) {
    (**(code **)(*local_b00 + 0x18))();
  }
  local_960 = &local_af8;
  pvVar10 = std::
            vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
            ::operator[]((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                          *)(local_af8 + 0xf),0);
  local_88 = (ulong)local_aec;
  local_958 = local_88;
  local_950 = pvVar10;
  local_28 = local_88;
  local_20 = pvVar10;
  if (pvVar10->size_alloced < local_88) {
    local_18 = local_88;
    if (pvVar10->size_alloced != 0) {
      local_30 = pvVar10->size_alloced;
      while (local_30 < local_28) {
        local_40[1] = 1;
        local_40[0] = local_30 << 1;
        puVar13 = std::max<unsigned_long>(local_40 + 1,local_40);
        local_30 = *puVar13;
      }
      local_18 = local_30;
    }
  }
  else {
    local_18 = pvVar10->size_alloced;
  }
  local_90 = local_18;
  uVar8 = local_88;
  if (local_88 < pvVar10->size_active) {
    while (local_98 = uVar8, local_98 < pvVar10->size_active) {
      uVar8 = local_98 + 1;
    }
    pvVar10->size_active = local_88;
  }
  local_80 = pvVar10;
  if (local_18 == pvVar10->size_alloced) {
    for (local_a0 = pvVar10->size_active; local_a0 < local_88; local_a0 = local_a0 + 1) {
      local_10 = pvVar10->items + local_a0;
    }
    pvVar10->size_active = local_88;
  }
  else {
    local_a8 = pvVar10->items;
    local_78 = local_18;
    local_70 = pvVar10;
    pVVar11 = (Vec3fx *)alignedMalloc(in_stack_fffffffffffff2b8,(size_t)in_stack_fffffffffffff2b0);
    pvVar10->items = pVVar11;
    for (local_b0 = 0; local_b0 < pvVar10->size_active; local_b0 = local_b0 + 1) {
      local_60 = pvVar10->items + local_b0;
      local_68 = local_a8 + local_b0;
      uVar1 = *(undefined8 *)((long)&local_68->field_0 + 8);
      *(undefined8 *)&local_60->field_0 = *(undefined8 *)&local_68->field_0;
      *(undefined8 *)((long)&local_60->field_0 + 8) = uVar1;
    }
    for (local_b8 = pvVar10->size_active; local_b8 < local_88; local_b8 = local_b8 + 1) {
      local_8 = pvVar10->items + local_b8;
    }
    local_58 = pvVar10->size_alloced;
    local_50 = local_a8;
    local_48 = pvVar10;
    alignedFree(in_stack_fffffffffffff2a8);
    pvVar10->size_active = local_88;
    pvVar10->size_alloced = local_90;
  }
  if (local_ad4 == 2) {
    local_968 = &local_af8;
    local_8d8 = local_b40;
    local_b38 = 0;
    local_b30 = 0;
    local_b28 = 0;
    std::
    vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
    ::push_back(in_stack_fffffffffffff2b0,in_stack_fffffffffffff2a8);
    local_8d0 = local_b40;
    for (local_1c0 = 0; local_1c0 < local_b38; local_1c0 = local_1c0 + 1) {
    }
    local_1b0 = local_b30;
    local_1a8 = local_b28;
    local_1b8 = local_8d0;
    local_1a0 = local_8d0;
    alignedFree(in_stack_fffffffffffff2a8);
    local_b28 = 0;
    local_b30 = 0;
    local_b38 = 0;
    local_970 = &local_af8;
    pvVar12 = std::
              vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
              ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                            *)(local_af8 + 0x12),0);
    local_150 = (ulong)local_aec;
    local_a78 = local_150;
    local_a70 = pvVar12;
    local_e0 = local_150;
    local_d8 = pvVar12;
    if (pvVar12->size_alloced < local_150) {
      local_d0 = local_150;
      if (pvVar12->size_alloced != 0) {
        local_e8 = pvVar12->size_alloced;
        while (local_e8 < local_e0) {
          local_f8[1] = 1;
          local_f8[0] = local_e8 << 1;
          puVar13 = std::max<unsigned_long>(local_f8 + 1,local_f8);
          local_e8 = *puVar13;
        }
        local_d0 = local_e8;
      }
    }
    else {
      local_d0 = pvVar12->size_alloced;
    }
    local_158 = local_d0;
    uVar8 = local_150;
    if (local_150 < pvVar12->size_active) {
      while (local_160 = uVar8, local_160 < pvVar12->size_active) {
        uVar8 = local_160 + 1;
      }
      pvVar12->size_active = local_150;
    }
    local_148 = pvVar12;
    if (local_d0 == pvVar12->size_alloced) {
      for (local_168 = pvVar12->size_active; local_168 < local_150; local_168 = local_168 + 1) {
        local_140 = pvVar12->items + local_168;
      }
      pvVar12->size_active = local_150;
    }
    else {
      local_170 = pvVar12->items;
      local_108 = local_d0;
      local_100 = pvVar12;
      pVVar14 = (Vec3fa *)alignedMalloc(in_stack_fffffffffffff2b8,(size_t)in_stack_fffffffffffff2b0)
      ;
      pvVar12->items = pVVar14;
      for (local_178 = 0; local_178 < pvVar12->size_active; local_178 = local_178 + 1) {
        local_128 = pvVar12->items + local_178;
        local_130 = local_170 + local_178;
        uVar1 = *(undefined8 *)((long)&local_130->field_0 + 8);
        *(undefined8 *)&local_128->field_0 = *(undefined8 *)&local_130->field_0;
        *(undefined8 *)((long)&local_128->field_0 + 8) = uVar1;
      }
      for (local_180 = pvVar12->size_active; local_180 < local_150; local_180 = local_180 + 1) {
        local_138 = pvVar12->items + local_180;
      }
      local_120 = pvVar12->size_alloced;
      local_118 = local_170;
      local_110 = pvVar12;
      alignedFree(in_stack_fffffffffffff2a8);
      pvVar12->size_active = local_150;
      pvVar12->size_alloced = local_158;
    }
  }
  local_9fc = (float)local_ae8;
  local_838._4_4_ = 0;
  local_838._0_4_ = local_9fc;
  local_a18 = local_838._0_8_;
  uStack_a10 = 0;
  local_7d8 = local_838._0_8_;
  uStack_7d0 = 0;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_838._0_8_;
  local_a28 = rcpss(auVar3,auVar3);
  local_83c = 0x40000000;
  local_858 = ZEXT416(0x40000000);
  local_778 = local_838._0_8_;
  uStack_770 = 0;
  local_768._0_4_ = local_a28._0_4_;
  local_b44 = (float)local_768;
  local_768._4_4_ = local_a28._4_4_;
  local_768._0_4_ = (float)local_768 * local_9fc;
  uStack_760 = local_a28._8_8_;
  local_718 = local_768;
  uStack_710 = local_a28._8_8_;
  fVar15 = 2.0 - (float)local_768;
  local_708 = (ulong)(uint)fVar15;
  uStack_700 = 0;
  local_798 = local_708;
  uStack_790 = 0;
  local_b44 = local_b44 * fVar15;
  local_788 = CONCAT44(local_768._4_4_,local_b44);
  uStack_780 = local_a28._8_8_;
  local_7b8 = local_788;
  uStack_7b0 = local_a28._8_8_;
  local_a2c = (float)local_ae4;
  local_7f8._4_4_ = 0;
  local_7f8._0_4_ = local_a2c;
  local_a48 = local_7f8._0_8_;
  uStack_a40 = 0;
  local_7c8 = local_7f8._0_8_;
  uStack_7c0 = 0;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_7f8._0_8_;
  local_a58 = rcpss(auVar4,auVar4);
  local_7fc = 0x40000000;
  local_818 = ZEXT416(0x40000000);
  local_738 = local_7f8._0_8_;
  uStack_730 = 0;
  local_728._0_4_ = local_a58._0_4_;
  local_b48 = (float)local_728;
  local_728._4_4_ = local_a58._4_4_;
  local_728._0_4_ = (float)local_728 * local_a2c;
  uStack_720 = local_a58._8_8_;
  local_6f8 = local_728;
  uStack_6f0 = local_a58._8_8_;
  fVar15 = 2.0 - (float)local_728;
  local_6e8 = (ulong)(uint)fVar15;
  uStack_6e0 = 0;
  local_758 = local_6e8;
  uStack_750 = 0;
  local_b48 = local_b48 * fVar15;
  local_748 = CONCAT44(local_728._4_4_,local_b48);
  uStack_740 = local_a58._8_8_;
  local_7a8 = local_748;
  uStack_7a0 = local_a58._8_8_;
  local_838 = ZEXT416((uint)local_9fc);
  local_81c = local_9fc;
  local_7f8 = ZEXT416((uint)local_a2c);
  local_7dc = local_a2c;
  for (local_b4c = 0; local_b4c <= local_ae4; local_b4c = local_b4c + 1) {
    for (local_b50 = 0; fVar15 = local_ac4, local_b50 < local_ae8; local_b50 = local_b50 + 1) {
      local_9f0 = &pi;
      local_b54 = (float)local_b4c * 3.1415927 * local_b48;
      local_9f8 = &pi;
      local_b58 = (float)local_b50 * 2.0 * 3.1415927 * local_b44;
      fVar18 = *local_ac0;
      local_9dc = local_b54;
      fVar16 = sinf(local_b54);
      local_9e0 = local_b58;
      fVar17 = sinf(local_b58);
      local_978 = &local_af8;
      local_900 = std::
                  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                  ::operator[]((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                                *)(local_af8 + 0xf),0);
      fVar19 = local_ac4;
      local_908 = (ulong)(local_b4c * local_ae8 + local_b50);
      local_900->items[local_908].field_0.m128[0] = fVar15 * fVar16 * fVar17 + fVar18;
      fVar15 = local_ac0[1];
      local_9d4 = local_b54;
      fVar18 = cosf(local_b54);
      fVar15 = fVar19 * fVar18 + fVar15;
      local_980 = &local_af8;
      local_910 = std::
                  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                  ::operator[]((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                                *)(local_af8 + 0xf),0);
      local_918 = (ulong)(local_b4c * local_ae8 + local_b50);
      local_910->items[local_918].field_0.m128[1] = fVar15;
      fVar15 = local_ac0[2];
      local_9e4 = local_b54;
      fVar19 = local_ac4;
      fVar16 = sinf(local_b54);
      local_9d8 = local_b58;
      fVar17 = cosf(local_b58);
      local_988 = &local_af8;
      local_920 = std::
                  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                  ::operator[]((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                                *)(local_af8 + 0xf),0);
      fVar18 = local_ac8;
      local_928 = (ulong)(local_b4c * local_ae8 + local_b50);
      local_920->items[local_928].field_0.m128[2] = fVar19 * fVar16 * fVar17 + fVar15;
      local_990 = &local_af8;
      local_930 = std::
                  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                  ::operator[]((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                                *)(local_af8 + 0xf),0);
      local_938 = (ulong)(local_b4c * local_ae8 + local_b50);
      local_930->items[local_938].field_0.m128[3] = fVar18;
      if (local_ad4 == 2) {
        local_998 = &local_af8;
        local_940 = std::
                    vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                    ::operator[]((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                                  *)(local_af8 + 0xf),0);
        local_948 = (ulong)(local_b4c * local_ae8 + local_b50);
        local_8a8 = local_940->items + local_948;
        local_8a0 = &local_b88;
        local_898 = *(undefined8 *)&local_8a8->field_0;
        uStack_890 = *(undefined8 *)((long)&local_8a8->field_0 + 8);
        local_880 = &local_b88;
        local_8b0 = &local_b78;
        local_8b8 = &local_b88;
        local_8c0 = local_ac0;
        uVar1 = *(undefined8 *)local_ac0;
        uVar2 = *(undefined8 *)(local_ac0 + 2);
        local_1e8._0_4_ = (float)local_898;
        local_1e8._4_4_ = (float)((ulong)local_898 >> 0x20);
        uStack_1e0._0_4_ = (float)uStack_890;
        uStack_1e0._4_4_ = (float)((ulong)uStack_890 >> 0x20);
        local_1f8._0_4_ = (float)uVar1;
        local_1f8._4_4_ = (float)((ulong)uVar1 >> 0x20);
        uStack_1f0._0_4_ = (float)uVar2;
        uStack_1f0._4_4_ = (float)((ulong)uVar2 >> 0x20);
        local_878 = (float)local_1e8 - (float)local_1f8;
        fStack_874 = local_1e8._4_4_ - local_1f8._4_4_;
        fStack_870 = (float)uStack_1e0 - (float)uStack_1f0;
        fStack_86c = uStack_1e0._4_4_ - uStack_1f0._4_4_;
        local_860 = &local_b78;
        local_658 = CONCAT44(fStack_874,local_878);
        uStack_650 = CONCAT44(fStack_86c,fStack_870);
        local_9b8 = &local_b68;
        local_9c0 = &local_b78;
        local_4a0 = &local_4d8;
        local_498 = local_878 * local_878;
        fStack_494 = fStack_874 * fStack_874;
        fStack_490 = fStack_870 * fStack_870;
        fStack_48c = fStack_86c * fStack_86c;
        local_3b8 = CONCAT44(fStack_494,local_498);
        uStack_3b0 = CONCAT44(fStack_48c,fStack_490);
        local_3a8 = &local_3e8;
        local_398 = &local_3f8;
        local_318 = CONCAT44(fStack_494,fStack_494);
        uStack_310 = CONCAT44(fStack_494,fStack_494);
        local_2b0 = &local_3f8;
        local_388 = &local_408;
        local_390 = &local_3e8;
        local_368 = CONCAT44(fStack_490,fStack_490);
        uStack_360 = CONCAT44(fStack_490,fStack_490);
        local_230 = &local_408;
        local_320 = &local_428;
        local_328 = &local_3e8;
        local_330 = &local_3f8;
        local_2f8 = local_498 + fStack_494;
        fStack_2f4 = fStack_494 + fStack_494;
        fStack_2f0 = fStack_490 + fStack_494;
        fStack_2ec = fStack_48c + fStack_494;
        local_2e8 = &local_428;
        local_358 = CONCAT44(fStack_2f4,local_2f8);
        uStack_350 = CONCAT44(fStack_2ec,fStack_2f0);
        local_370 = &local_418;
        local_378 = &local_428;
        local_380 = &local_408;
        local_5ec = local_2f8 + fStack_490;
        fStack_344 = fStack_2f4 + fStack_490;
        fStack_340 = fStack_2f0 + fStack_490;
        fStack_33c = fStack_2ec + fStack_490;
        local_338 = &local_418;
        local_3c8 = CONCAT44(fStack_344,local_5ec);
        uStack_3c0 = CONCAT44(fStack_33c,fStack_340);
        local_2e0 = &local_418;
        local_5a8 = ZEXT416((uint)local_5ec);
        local_608 = CONCAT44(0,local_5ec);
        uStack_600 = 0;
        uStack_450 = 0;
        auVar5._8_8_ = 0;
        auVar5._0_8_ = local_608;
        local_618 = rsqrtss(auVar5,auVar5);
        local_5ac = 0x3fc00000;
        local_5c8 = ZEXT416(0x3fc00000);
        local_4f8 = local_618._0_8_;
        uVar7 = local_4f8;
        uStack_4f0 = local_618._8_8_;
        local_4f8._0_4_ = local_618._0_4_;
        local_4e8 = (ulong)(uint)((float)local_4f8 * 1.5);
        uStack_4e0 = 0;
        local_5cc = 0xbf000000;
        local_5e8 = ZEXT416(0xbf000000);
        local_518 = local_5e8._0_8_;
        uStack_510 = 0;
        local_508 = (ulong)(uint)(local_5ec * -0.5);
        uStack_500 = 0;
        local_538 = local_618._0_8_;
        uStack_530 = local_618._8_8_;
        local_6c4 = local_5ec * -0.5 * (float)local_4f8;
        local_528 = (ulong)(uint)local_6c4;
        uStack_520 = 0;
        local_558 = local_618._0_8_;
        uStack_550 = local_618._8_8_;
        local_548 = CONCAT44(local_618._4_4_,(float)local_4f8 * (float)local_4f8);
        uStack_540 = local_618._8_8_;
        local_578 = local_548;
        uStack_570 = local_618._8_8_;
        local_6c4 = local_6c4 * (float)local_4f8 * (float)local_4f8;
        local_568 = (ulong)(uint)local_6c4;
        uStack_560 = 0;
        local_448 = local_568;
        uStack_440 = 0;
        local_6c4 = (float)local_4f8 * 1.5 + local_6c4;
        local_438 = (ulong)(uint)local_6c4;
        uStack_430 = 0;
        local_628 = local_438;
        uStack_620 = 0;
        local_588 = local_438;
        uStack_580 = 0;
        local_6b8 = &local_b68;
        local_670 = &local_6d8;
        local_668 = CONCAT44(local_6c4,local_6c4);
        uStack_660 = CONCAT44(local_6c4,local_6c4);
        local_6a0 = &local_b68;
        local_6b0 = &local_6d8;
        local_698 = local_878 * local_6c4;
        fStack_694 = fStack_874 * local_6c4;
        fStack_690 = fStack_870 * local_6c4;
        fStack_68c = fStack_86c * local_6c4;
        local_680 = &local_b68;
        local_b68 = CONCAT44(fStack_694,local_698);
        uStack_b60 = CONCAT44(fStack_68c,fStack_690);
        local_9a0 = &local_af8;
        local_6c0 = local_9c0;
        local_6a8 = local_9c0;
        local_674 = local_6c4;
        local_648 = local_6c4;
        fStack_644 = local_6c4;
        fStack_640 = local_6c4;
        fStack_63c = local_6c4;
        local_638 = local_6c4;
        local_58c = local_5ec;
        local_4f8 = uVar7;
        local_4c0 = local_9c0;
        local_4b8 = local_9c0;
        local_4b0 = local_9c0;
        local_4a8 = local_9c0;
        local_480 = local_4a0;
        local_478 = local_658;
        uStack_470 = uStack_650;
        local_468 = local_658;
        uStack_460 = uStack_650;
        local_458 = local_608;
        local_3d0 = local_4a0;
        local_3a0 = local_3a8;
        local_348 = local_5ec;
        local_308 = local_3b8;
        uStack_300 = uStack_3b0;
        local_2d8 = local_3a8;
        local_2d0 = local_398;
        local_2c8 = local_318;
        uStack_2c0 = uStack_310;
        local_2a8 = fStack_494;
        fStack_2a4 = fStack_494;
        fStack_2a0 = fStack_494;
        fStack_29c = fStack_494;
        local_298 = local_3b8;
        uStack_290 = uStack_3b0;
        local_280 = local_3a8;
        local_278 = local_330;
        local_270 = local_328;
        local_268 = local_380;
        local_260 = local_378;
        local_258 = local_390;
        local_250 = local_388;
        local_248 = local_368;
        uStack_240 = uStack_360;
        local_228 = fStack_490;
        fStack_224 = fStack_490;
        fStack_220 = fStack_490;
        fStack_21c = fStack_490;
        local_218 = local_3b8;
        uStack_210 = uStack_3b0;
        local_200 = local_390;
        local_1f8 = uVar1;
        uStack_1f0 = uVar2;
        local_1e8 = local_898;
        uStack_1e0 = uStack_890;
        local_b88 = local_898;
        uStack_b80 = uStack_890;
        local_b78 = local_658;
        uStack_b70 = uStack_650;
        local_6d8 = local_668;
        uStack_6d0 = uStack_660;
        local_4d8 = local_3b8;
        uStack_4d0 = uStack_3b0;
        local_428 = local_358;
        uStack_420 = uStack_350;
        local_418 = local_3c8;
        uStack_410 = uStack_3c0;
        local_408 = local_368;
        uStack_400 = uStack_360;
        local_3f8 = local_318;
        uStack_3f0 = uStack_310;
        local_3e8 = local_3b8;
        uStack_3e0 = uStack_3b0;
        local_a60 = std::
                    vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                    ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                  *)(local_af8 + 0x12),0);
        local_a68 = (ulong)(local_b4c * local_ae8 + local_b50);
        local_9c8 = &local_a60->items[local_a68].field_0;
        local_9d0 = &local_b68;
        aVar6._8_8_ = uStack_b60;
        aVar6._0_8_ = local_b68;
        *local_9c8 = aVar6;
      }
    }
  }
  local_8f8 = &local_af8;
  local_c8 = local_af8;
  (in_RDI->super_RefCount)._vptr_RefCount = local_af8;
  if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
    (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
  }
  local_8e8 = &local_af8;
  if (local_af8 != (_func_int **)0x0) {
    (**(code **)(*local_af8 + 0x18))();
  }
  return (Ref<embree::SceneGraph::Node>)in_RDI;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::createPointSphere (const Vec3fa& center, const float radius, const float pointRadius,
                                                       size_t N, PointSubtype subtype, Ref<MaterialNode> material)
  {
    unsigned numPhi = unsigned(N);
    unsigned numTheta = 2 * numPhi;
    unsigned numVertices = numTheta * (numPhi + 1);

    RTCGeometryType type;
    switch (subtype) {
      case SPHERE:
        type = RTC_GEOMETRY_TYPE_SPHERE_POINT;
        break;
      case DISC:
        type = RTC_GEOMETRY_TYPE_DISC_POINT;
        break;
      case ORIENTED_DISC:
        type = RTC_GEOMETRY_TYPE_ORIENTED_DISC_POINT;
        break;
    }

    Ref<SceneGraph::PointSetNode> mesh = new SceneGraph::PointSetNode(type, material, BBox1f(0,1), 1);
    mesh->positions[0].resize(numVertices);
    if (subtype == ORIENTED_DISC) {
      mesh->normals.push_back(avector<Vec3fa>());
      mesh->normals[0].resize(numVertices);
    }

    /* create sphere geometry */
    const float rcpNumTheta = rcp(float(numTheta));
    const float rcpNumPhi   = rcp(float(numPhi));
    for (unsigned int phi = 0; phi <= numPhi; phi++)
    {
      for (unsigned int theta = 0; theta < numTheta; theta++)
      {
        const float phif   = phi * float(pi) * rcpNumPhi;
        const float thetaf = theta * 2.0f * float(pi) * rcpNumTheta;
        mesh->positions[0][phi * numTheta + theta].x = center.x + radius * sin(phif) * sin(thetaf);
        mesh->positions[0][phi * numTheta + theta].y = center.y + radius * cos(phif);
        mesh->positions[0][phi * numTheta + theta].z = center.z + radius * sin(phif) * cos(thetaf);
        mesh->positions[0][phi * numTheta + theta].w = pointRadius;
        if (subtype == ORIENTED_DISC)
          mesh->normals[0][phi * numTheta + theta] =
            normalize(mesh->positions[0][phi * numTheta + theta] - center);
      }
    }
    return mesh.dynamicCast<SceneGraph::Node>();
  }